

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGetterCalls.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayGetterCalls::initTest(TextureCubeMapArrayGetterCalls *this)

{
  PNamesMap *pPVar1;
  mapped_type_conflict *pmVar2;
  NotSupportedError *this_00;
  PNamesVec *this_01;
  string local_58;
  allocator<char> local_31;
  
  if ((this->super_TestCaseBase).m_is_texture_cube_map_array_supported != false) {
    pPVar1 = &this->pnames_for_gettexparameter_default;
    local_58._M_dataplus._M_p._0_4_ = 0x813c;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0;
    local_58._M_dataplus._M_p._0_4_ = 0x813d;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 1000;
    local_58._M_dataplus._M_p._0_4_ = 0x2801;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x2702;
    local_58._M_dataplus._M_p._0_4_ = 0x2800;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x2601;
    local_58._M_dataplus._M_p._0_4_ = 0x813a;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = -1000;
    local_58._M_dataplus._M_p._0_4_ = 0x813b;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 1000;
    local_58._M_dataplus._M_p._0_4_ = 0x8e42;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x1903;
    local_58._M_dataplus._M_p._0_4_ = 0x8e43;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x1904;
    local_58._M_dataplus._M_p._0_4_ = 0x8e44;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x1905;
    local_58._M_dataplus._M_p._0_4_ = 0x8e45;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x1906;
    local_58._M_dataplus._M_p._0_4_ = 0x2802;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x2901;
    local_58._M_dataplus._M_p._0_4_ = 0x2803;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x2901;
    local_58._M_dataplus._M_p._0_4_ = 0x8072;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x2901;
    pPVar1 = &this->pnames_for_gettexparameter_modified;
    local_58._M_dataplus._M_p._0_4_ = 0x813c;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 1;
    local_58._M_dataplus._M_p._0_4_ = 0x813d;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 1;
    local_58._M_dataplus._M_p._0_4_ = 0x2801;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x2600;
    local_58._M_dataplus._M_p._0_4_ = 0x2800;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x2600;
    local_58._M_dataplus._M_p._0_4_ = 0x813a;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = -10;
    local_58._M_dataplus._M_p._0_4_ = 0x813b;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 10;
    local_58._M_dataplus._M_p._0_4_ = 0x8e42;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x1904;
    local_58._M_dataplus._M_p._0_4_ = 0x8e43;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x1905;
    local_58._M_dataplus._M_p._0_4_ = 0x8e44;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x1906;
    local_58._M_dataplus._M_p._0_4_ = 0x8e45;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x1903;
    local_58._M_dataplus._M_p._0_4_ = 0x2802;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x812f;
    local_58._M_dataplus._M_p._0_4_ = 0x2803;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x8370;
    local_58._M_dataplus._M_p._0_4_ = 0x8072;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_58);
    *pmVar2 = 0x812f;
    this_01 = &this->pnames_for_gettexlevelparameter;
    local_58._M_dataplus._M_p._0_4_ = 0x86a1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x805f;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x805e;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x805d;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x805c;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x884a;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x8c3f;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x88f1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x8c13;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x8c12;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x8c11;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x8c10;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x8c16;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x1003;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x1000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x1001;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    local_58._M_dataplus._M_p._0_4_ = 0x8071;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)&local_58);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Texture cube map array functionality not supported, skipping",
             &local_31);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_58);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArrayGetterCalls::initTest(void)
{
	/* Only execute if GL_EXT_texture_cube_map_array extension is supported */
	if (!m_is_texture_cube_map_array_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_CUBE_MAP_ARRAY_EXTENSION_NOT_SUPPORTED);
	}

	pnames_for_gettexparameter_default[GL_TEXTURE_BASE_LEVEL] = 0;
	pnames_for_gettexparameter_default[GL_TEXTURE_MAX_LEVEL]  = 1000;
	pnames_for_gettexparameter_default[GL_TEXTURE_MIN_FILTER] = GL_NEAREST_MIPMAP_LINEAR;
	pnames_for_gettexparameter_default[GL_TEXTURE_MAG_FILTER] = GL_LINEAR;
	pnames_for_gettexparameter_default[GL_TEXTURE_MIN_LOD]	= -1000;
	pnames_for_gettexparameter_default[GL_TEXTURE_MAX_LOD]	= 1000;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_R]  = GL_RED;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_G]  = GL_GREEN;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_B]  = GL_BLUE;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_A]  = GL_ALPHA;
	pnames_for_gettexparameter_default[GL_TEXTURE_WRAP_S]	 = GL_REPEAT;
	pnames_for_gettexparameter_default[GL_TEXTURE_WRAP_T]	 = GL_REPEAT;
	pnames_for_gettexparameter_default[GL_TEXTURE_WRAP_R]	 = GL_REPEAT;

	pnames_for_gettexparameter_modified[GL_TEXTURE_BASE_LEVEL] = 1;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MAX_LEVEL]  = 1;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MIN_FILTER] = GL_NEAREST;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MAG_FILTER] = GL_NEAREST;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MIN_LOD]	= -10;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MAX_LOD]	= 10;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_R]  = GL_GREEN;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_G]  = GL_BLUE;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_B]  = GL_ALPHA;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_A]  = GL_RED;
	pnames_for_gettexparameter_modified[GL_TEXTURE_WRAP_S]	 = GL_CLAMP_TO_EDGE;
	pnames_for_gettexparameter_modified[GL_TEXTURE_WRAP_T]	 = GL_MIRRORED_REPEAT;
	pnames_for_gettexparameter_modified[GL_TEXTURE_WRAP_R]	 = GL_CLAMP_TO_EDGE;

	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_COMPRESSED);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_ALPHA_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_BLUE_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_GREEN_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_RED_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_DEPTH_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_SHARED_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_STENCIL_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_ALPHA_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_BLUE_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_GREEN_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_RED_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_DEPTH_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_INTERNAL_FORMAT);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_WIDTH);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_HEIGHT);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_DEPTH);
}